

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

LY_ERR lys_check_features(lysp_module *pmod)

{
  uint in_EAX;
  LY_ERR LVar1;
  lysp_feature *last;
  ulong uStack_28;
  uint32_t i;
  
  uStack_28 = (ulong)in_EAX;
  last = (lysp_feature *)0x0;
  while( true ) {
    do {
      last = lysp_feature_next(last,pmod,&i);
      if (last == (lysp_feature *)0x0) {
        return LY_SUCCESS;
      }
    } while (((last->flags & 0x20) == 0) || (last->iffeatures == (lysp_qname *)0x0));
    if (last->iffeatures_c == (lysc_iffeature *)0x0) break;
    LVar1 = lysc_iffeature_value(last->iffeatures_c);
    if (LVar1 != LY_SUCCESS) {
      if (LVar1 == LY_ENOT) {
        LVar1 = LY_EDENIED;
        ly_log(pmod->mod->ctx,LY_LLERR,LY_EDENIED,
               "Feature \"%s\" cannot be enabled because its \"if-feature\" is not satisfied.",
               last->name);
      }
      return LVar1;
    }
  }
  __assert_fail("f->iffeatures_c",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                ,0x229,"LY_ERR lys_check_features(const struct lysp_module *)");
}

Assistant:

LY_ERR
lys_check_features(const struct lysp_module *pmod)
{
    LY_ERR r;
    uint32_t i = 0;
    struct lysp_feature *f = NULL;

    while ((f = lysp_feature_next(f, pmod, &i))) {
        if (!(f->flags & LYS_FENABLED) || !f->iffeatures) {
            /* disabled feature or no if-features to check */
            continue;
        }

        assert(f->iffeatures_c);
        r = lysc_iffeature_value(f->iffeatures_c);
        if (r == LY_ENOT) {
            LOGERR(pmod->mod->ctx, LY_EDENIED, "Feature \"%s\" cannot be enabled because its \"if-feature\" is not satisfied.",
                    f->name);
            return LY_EDENIED;
        } else if (r) {
            return r;
        } /* else if-feature satisfied */
    }

    return LY_SUCCESS;
}